

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void SimpleLoggerMgr::flushWorker(void)

{
  pthread_t __target_thread;
  SimpleLoggerMgr *this;
  ostream *poVar1;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"sl_flusher");
  this = get();
  while( true ) {
    do {
      if (((this->termination)._M_base._M_i & 1U) != 0) {
        return;
      }
      sleepFlusher(this,500);
      flushAllLoggers(this);
    } while ((this->abortTimer).super___atomic_base<unsigned_long>._M_i == 0);
    if ((this->abortTimer).super___atomic_base<unsigned_long>._M_i < 0x1f5) break;
    LOCK();
    (this->abortTimer).super___atomic_base<unsigned_long>._M_i =
         (this->abortTimer).super___atomic_base<unsigned_long>._M_i - 500;
    UNLOCK();
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"STACK DUMP TIMEOUT, FORCE ABORT");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::flushWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_flusher");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        mgr->sleepFlusher(sub_ms);
        mgr->flushAllLoggers();
        if (mgr->abortTimer) {
            if (mgr->abortTimer > sub_ms) {
                mgr->abortTimer.fetch_sub(sub_ms);
            } else {
                std::cerr << "STACK DUMP TIMEOUT, FORCE ABORT" << std::endl;
                exit(-1);
            }
        }
    }
}